

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::LiteralStringWithPropertyStringPtr::GetPropertyRecordImpl
          (LiteralStringWithPropertyStringPtr *this,PropertyRecord **propRecord,
          bool dontLookupFromDictionary)

{
  PropertyRecord *pPVar1;
  
  pPVar1 = (this->propertyRecord).ptr;
  if (pPVar1 == (PropertyRecord *)0x0) {
    JavascriptString::GetPropertyRecord
              ((JavascriptString *)this,propRecord,dontLookupFromDictionary);
    if (*propRecord != (PropertyRecord *)0x0) {
      CachePropertyRecordImpl(this,*propRecord);
      return;
    }
  }
  else {
    *propRecord = pPVar1;
  }
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::GetPropertyRecordImpl(_Out_ PropertyRecord const** propRecord, bool dontLookupFromDictionary)
    {
        if (this->propertyRecord)
        {
            *propRecord = this->propertyRecord;
            return;
        }

        __super::GetPropertyRecord(propRecord, dontLookupFromDictionary);

        if (*propRecord)
        {
            CachePropertyRecordImpl(*propRecord);
        }
    }